

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O2

void __thiscall cmBoundsCheckerParser::ParseError(cmBoundsCheckerParser *this,char **atts)

{
  cmCTest *this_00;
  int iVar1;
  char *__s2;
  int *__x;
  char *local_1b0 [4];
  ostringstream cmCTestLog_msg;
  
  __s2 = GetAttribute(this,"ErrorCategory",atts);
  if (__s2 == (char *)0x0) {
    _cmCTestLog_msg = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->Errors,(int *)&cmCTestLog_msg);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::operator<<((ostream *)&cmCTestLog_msg,"No Category found in Bounds checker XML\n");
    this_00 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x5f,local_1b0[0],false);
    std::__cxx11::string::~string((string *)local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  else {
    for (__x = &cmCTestMemCheckBoundsChecker[0].ErrorCode;
        ((CatToErrorType *)(__x + -2))->ErrorCategory != (char *)0x0; __x = __x + 4) {
      iVar1 = strcmp(((CatToErrorType *)(__x + -2))->ErrorCategory,__s2);
      if (iVar1 == 0) {
        std::vector<int,_std::allocator<int>_>::push_back(&this->Errors,__x);
        return;
      }
    }
  }
  return;
}

Assistant:

void ParseError(const char** atts)
  {
    CatToErrorType* ptr = cmCTestMemCheckBoundsChecker;
    const char* cat = this->GetAttribute("ErrorCategory", atts);
    if (!cat) {
      this->Errors.push_back(cmCTestMemCheckHandler::ABW); // do not know
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "No Category found in Bounds checker XML\n");
      return;
    }
    while (ptr->ErrorCategory && cat) {
      if (strcmp(ptr->ErrorCategory, cat) == 0) {
        this->Errors.push_back(ptr->ErrorCode);
        return; // found it we are done
      }
      ptr++;
    }
    if (ptr->ErrorCategory) {
      this->Errors.push_back(cmCTestMemCheckHandler::ABW); // do not know
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Found unknown Bounds Checker error " << ptr->ErrorCategory
                                                       << std::endl);
    }
  }